

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_se(bitstream *str,h264_cabac_context *cabac,h264_cabac_se_val *tab,int *ctxIdx,
                 uint32_t *val)

{
  int iVar1;
  int aiStack_98 [2];
  int bidx [8];
  uint32_t bit_1 [8];
  int local_4c;
  int local_48;
  int j_1;
  int i_1;
  uint32_t bit;
  int j;
  int i;
  uint32_t *val_local;
  int *ctxIdx_local;
  h264_cabac_se_val *tab_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  cabac_local = (h264_cabac_context *)str;
  tab_local = (h264_cabac_se_val *)cabac;
  ctxIdx_local = &tab->val;
  val_local = (uint32_t *)ctxIdx;
  _j = val;
  if (str->dir == VS_ENCODE) {
    bit = 0;
    while (ctxIdx_local[(long)(int)bit * 0x16 + 4] != 0) {
      if (*(long *)(ctxIdx_local + (long)(int)bit * 0x16 + 2) == 0) {
        if (*_j == ctxIdx_local[(long)(int)bit * 0x16]) goto LAB_00111517;
      }
      else {
        iVar1 = in_tab(*(h264_cabac_se_val **)(ctxIdx_local + (long)(int)bit * 0x16 + 2),*_j);
        if (iVar1 != 0) {
LAB_00111517:
          i_1 = 0;
          while( true ) {
            if (ctxIdx_local[(long)(int)bit * 0x16 + 4] <= i_1) {
              if (*(long *)(ctxIdx_local + (long)(int)bit * 0x16 + 2) != 0) {
                iVar1 = h264_cabac_se((bitstream *)cabac_local,(h264_cabac_context *)tab_local,
                                      *(h264_cabac_se_val **)
                                       (ctxIdx_local + (long)(int)bit * 0x16 + 2),(int *)val_local,
                                      _j);
                return iVar1;
              }
              return 0;
            }
            j_1 = ctxIdx_local[(long)(int)bit * 0x16 + (long)i_1 * 2 + 6];
            iVar1 = h264_cabac_decision((bitstream *)cabac_local,(h264_cabac_context *)tab_local,
                                        val_local[ctxIdx_local
                                                  [(long)(int)bit * 0x16 + (long)i_1 * 2 + 5]],
                                        (uint32_t *)&j_1);
            if (iVar1 != 0) break;
            i_1 = i_1 + 1;
          }
          return 1;
        }
      }
      bit = bit + 1;
    }
    fprintf(_stderr,"No binarization for a value\n");
  }
  else {
    for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
      aiStack_98[local_48] = -1;
    }
    local_48 = 0;
    while (ctxIdx_local[(long)local_48 * 0x16 + 4] != 0) {
      for (local_4c = 0; local_4c < ctxIdx_local[(long)local_48 * 0x16 + 4]; local_4c = local_4c + 1
          ) {
        if (aiStack_98[local_4c] == -1) {
          aiStack_98[local_4c] = ctxIdx_local[(long)local_48 * 0x16 + (long)local_4c * 2 + 5];
          iVar1 = h264_cabac_decision((bitstream *)cabac_local,(h264_cabac_context *)tab_local,
                                      val_local[aiStack_98[local_4c]],
                                      (uint32_t *)(bidx + (long)local_4c + 6));
          if (iVar1 != 0) {
            return 1;
          }
        }
        if (aiStack_98[local_4c] != ctxIdx_local[(long)local_48 * 0x16 + (long)local_4c * 2 + 5]) {
          fprintf(_stderr,"Inconsistent CABAC se table!\n");
          return 1;
        }
        if (bidx[(long)local_4c + 6] != ctxIdx_local[(long)local_48 * 0x16 + (long)local_4c * 2 + 6]
           ) break;
      }
      if (local_4c == ctxIdx_local[(long)local_48 * 0x16 + 4]) {
        if (*(long *)(ctxIdx_local + (long)local_48 * 0x16 + 2) != 0) {
          iVar1 = h264_cabac_se((bitstream *)cabac_local,(h264_cabac_context *)tab_local,
                                *(h264_cabac_se_val **)(ctxIdx_local + (long)local_48 * 0x16 + 2),
                                (int *)val_local,_j);
          return iVar1;
        }
        *_j = ctxIdx_local[(long)local_48 * 0x16];
        return 0;
      }
      local_48 = local_48 + 1;
    }
    fprintf(_stderr,"No value for a binarization\n");
  }
  return 1;
}

Assistant:

int h264_cabac_se(struct bitstream *str, struct h264_cabac_context *cabac, const struct h264_cabac_se_val *tab, int *ctxIdx, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		int i, j;
		for (i = 0; tab[i].blen; i++) {
			if (tab[i].subtab ? in_tab(tab[i].subtab, *val) : *val == tab[i].val) {
				uint32_t bit;
				for (j = 0; j < tab[i].blen; j++) {
					bit = tab[i].bits[j].val;
					if (h264_cabac_decision(str, cabac, ctxIdx[tab[i].bits[j].bidx], &bit))
						return 1;
				}
				if (tab[i].subtab)
					return h264_cabac_se(str, cabac, tab[i].subtab, ctxIdx, val);
				else
					return 0;
			}
		}
		fprintf(stderr, "No binarization for a value\n");
		return 1;
	} else {
		int i, j;
		uint32_t bit[8];
		int bidx[8];
		for (i = 0; i < 8; i++)
			bidx[i] = -1;
		for (i = 0; tab[i].blen; i++) {
			for (j = 0; j < tab[i].blen; j++) {
				if (bidx[j] == -1) {
					bidx[j] = tab[i].bits[j].bidx;
					if (h264_cabac_decision(str, cabac, ctxIdx[bidx[j]], &bit[j]))
						return 1;
				}
				if (bidx[j] != tab[i].bits[j].bidx) {
					fprintf(stderr, "Inconsistent CABAC se table!\n");
					return 1;
				}
				if (bit[j] != tab[i].bits[j].val)
					break;
			}
			if (j == tab[i].blen) {
				if (tab[i].subtab) {
					return h264_cabac_se(str, cabac, tab[i].subtab, ctxIdx, val);
				} else {
					*val = tab[i].val;
					return 0;
				}
			}
		}
		fprintf(stderr, "No value for a binarization\n");
		return 1;
	}
}